

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mesh.c
# Opt level: O0

attr interpolate_real(mesh *mesh,attr_buf *attr_buf,size_t primitive_index,vec2 *uv)

{
  void *pvVar1;
  attr aVar2;
  real_t w;
  real_t z_1;
  real_t y_1;
  real_t x_1;
  real_t z;
  real_t y;
  real_t x;
  real_t *data;
  vec2 *uv_local;
  size_t primitive_index_local;
  attr_buf *attr_buf_local;
  mesh *mesh_local;
  
  pvVar1 = attr_buf->data;
  if (mesh->type == TRI_MESH) {
    mesh_local._0_4_ =
         lerp3_real(*(real_t *)((long)pvVar1 + mesh->indices[primitive_index * 3] * 4),
                    *(real_t *)((long)pvVar1 + mesh->indices[primitive_index * 3 + 1] * 4),
                    *(real_t *)((long)pvVar1 + mesh->indices[primitive_index * 3 + 2] * 4),uv->_[0],
                    uv->_[1]);
  }
  else {
    mesh_local._0_4_ =
         lerp4_real(*(real_t *)((long)pvVar1 + mesh->indices[primitive_index * 4] * 4),
                    *(real_t *)((long)pvVar1 + mesh->indices[primitive_index * 4 + 1] * 4),
                    *(real_t *)((long)pvVar1 + mesh->indices[primitive_index * 4 + 2] * 4),
                    *(real_t *)((long)pvVar1 + mesh->indices[primitive_index * 4 + 3] * 4),uv->_[0],
                    uv->_[1]);
  }
  aVar2._4_12_ = stack0xffffffffffffffec;
  aVar2.real = mesh_local._0_4_;
  return aVar2;
}

Assistant:

GEN_INTERPOLATE(struct vec2, vec2)
GEN_INTERPOLATE(struct vec3, vec3)
GEN_INTERPOLATE(struct vec4, vec4)

union attr get_mesh_attr(
    const struct mesh* mesh,
    unsigned attr_index,
    size_t primitive_index,
    const struct vec2* uv)
{
    assert(attr_index < mesh->attr_count);
    assert(primitive_index < mesh->primitive_count);
    const struct attr_buf* attr_buf = &mesh->attrs[attr_index];
    if (attr_buf->binding == PER_FACE) {
        // The attribute is per-face, no need to interpolate
        switch (attr_buf->type) {
#define f(name, tag, type) \
            case ATTR_##tag: \
                return (union attr) { .name = ((const type*)attr_buf->data)[primitive_index] };
            ATTR_LIST(f)
#undef f
            default:
                assert(false);
                return (union attr) { .uint = 0 };
        }
    } else {
        // The attribute is per-vertex. It requires interpolation.
        assert(attr_buf->binding == PER_VERTEX);
        switch (attr_buf->type) {
#define f(name, tag, type) \
            case ATTR_##tag: \
                return interpolate_##name(mesh, attr_buf, primitive_index, uv);
            ATTR_LIST(f)
#undef f
            default:
                assert(false);
                return (union attr) { .uint = 0 };
        }
    }
}